

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIsComplete.cpp
# Opt level: O2

void testIsComplete(string *tempDir)

{
  uint __line;
  _Alloc_hider _Var1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  char *__assertion;
  int x;
  long lVar9;
  long lVar10;
  int y;
  long lVar11;
  float in_XMM2_Da;
  RgbaOutputFile out;
  half local_136;
  half local_134;
  half local_132;
  Array2D<Imf_2_5::Rgba> pixels;
  undefined8 local_d0;
  undefined8 local_c8;
  V2f local_c0;
  V2f local_b8;
  string ict;
  string ct;
  string icsl;
  string csl;
  
  poVar8 = std::operator<<((ostream *)&std::cout,"Testing isComplete() function");
  std::endl<char,std::char_traits<char>>(poVar8);
  std::operator+(&csl,tempDir,"imf_test_complete_sl.exr");
  std::operator+(&icsl,tempDir,"imf_test_incomplete_sl.exr");
  std::operator+(&ct,tempDir,"imf_test_complete_t.exr");
  std::operator+(&ict,tempDir,"imf_test_incomplete_t.exr");
  _Var4 = csl._M_dataplus;
  _Var3 = icsl._M_dataplus;
  _Var2 = ct._M_dataplus;
  _Var1 = ict._M_dataplus;
  pixels._sizeX = 0x121;
  pixels._sizeY = 0x147;
  pixels._data = (Rgba *)operator_new__(0xb8938);
  lVar10 = 0;
  for (lVar11 = 0; lVar11 != 0x121; lVar11 = lVar11 + 1) {
    for (lVar9 = 0; lVar9 != 0x147; lVar9 = lVar9 + 1) {
      half::half(&local_132,(float)(int)lVar9);
      half::half(&local_134,(float)(int)lVar11);
      half::half(&local_136,1.0);
      *(ulong *)((long)&pixels._data[lVar9].r._h + pixels._sizeY * lVar10) =
           (ulong)CONCAT22(local_134._h,local_132._h) | (ulong)local_136._h << 0x30;
    }
    lVar10 = lVar10 + 8;
  }
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  iVar6 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile
            (&out,_Var4._M_p,0x147,0x121,WRITE_RGBA,1.0,&local_b8,1.0,INCREASING_Y,PIZ_COMPRESSION,
             iVar6);
  Imf_2_5::RgbaOutputFile::setFrameBuffer(&out,pixels._data,1,0x147);
  Imf_2_5::RgbaOutputFile::writePixels(&out,0x121);
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&out);
  local_c0.x = 0.0;
  local_c0.y = 0.0;
  iVar6 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile
            (&out,_Var3._M_p,0x147,0x121,WRITE_RGBA,1.0,&local_c0,1.0,INCREASING_Y,PIZ_COMPRESSION,
             iVar6);
  Imf_2_5::RgbaOutputFile::setFrameBuffer(&out,pixels._data,1,0x147);
  Imf_2_5::RgbaOutputFile::writePixels(&out,0x120);
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&out);
  local_c8 = 0;
  Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)&out,_Var2._M_p,0x147,0x121,0x11,0x11,ONE_LEVEL,ROUND_DOWN,
             WRITE_RGBA,1.0,(V2f)0x3f800000,in_XMM2_Da,(LineOrder)&local_c8,NO_COMPRESSION,3);
  Imf_2_5::TiledRgbaOutputFile::setFrameBuffer((TiledRgbaOutputFile *)&out,pixels._data,1,0x147);
  iVar6 = Imf_2_5::TiledRgbaOutputFile::numXTiles((TiledRgbaOutputFile *)&out,0);
  iVar7 = Imf_2_5::TiledRgbaOutputFile::numYTiles((TiledRgbaOutputFile *)&out,0);
  Imf_2_5::TiledRgbaOutputFile::writeTiles((TiledRgbaOutputFile *)&out,0,iVar6 + -1,0,iVar7 + -1,0);
  Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
  local_d0 = 0;
  Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)&out,_Var1._M_p,0x147,0x121,0x11,0x11,ONE_LEVEL,ROUND_DOWN,
             WRITE_RGBA,1.0,(V2f)0x3f800000,in_XMM2_Da,(LineOrder)&local_d0,NO_COMPRESSION,3);
  Imf_2_5::TiledRgbaOutputFile::setFrameBuffer((TiledRgbaOutputFile *)&out,pixels._data,1,0x147);
  iVar6 = Imf_2_5::TiledRgbaOutputFile::numXTiles((TiledRgbaOutputFile *)&out,0);
  iVar7 = Imf_2_5::TiledRgbaOutputFile::numYTiles((TiledRgbaOutputFile *)&out,0);
  Imf_2_5::TiledRgbaOutputFile::writeTiles((TiledRgbaOutputFile *)&out,0,iVar6 + -1,0,iVar7 + -2,0);
  Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(&pixels);
  _Var4 = csl._M_dataplus;
  _Var3 = icsl._M_dataplus;
  _Var2 = ct._M_dataplus;
  _Var1 = ict._M_dataplus;
  iVar6 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&pixels,_Var4._M_p,iVar6);
  bVar5 = Imf_2_5::RgbaInputFile::isComplete((RgbaInputFile *)&pixels);
  if (bVar5) {
    Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&pixels);
    iVar6 = Imf_2_5::globalThreadCount();
    Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&pixels,_Var3._M_p,iVar6);
    bVar5 = Imf_2_5::RgbaInputFile::isComplete((RgbaInputFile *)&pixels);
    if (bVar5) {
      __assertion = "!in.isComplete()";
      __line = 0x73;
    }
    else {
      Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&pixels);
      iVar6 = Imf_2_5::globalThreadCount();
      Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&pixels,_Var2._M_p,iVar6);
      bVar5 = Imf_2_5::RgbaInputFile::isComplete((RgbaInputFile *)&pixels);
      if (bVar5) {
        Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&pixels);
        iVar6 = Imf_2_5::globalThreadCount();
        Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&pixels,_Var1._M_p,iVar6);
        bVar5 = Imf_2_5::RgbaInputFile::isComplete((RgbaInputFile *)&pixels);
        if (!bVar5) {
          Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&pixels);
          iVar6 = Imf_2_5::globalThreadCount();
          Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                    ((TiledRgbaInputFile *)&pixels,_Var2._M_p,iVar6);
          bVar5 = Imf_2_5::TiledRgbaInputFile::isComplete((TiledRgbaInputFile *)&pixels);
          if (!bVar5) {
            __assert_fail("in.isComplete()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testIsComplete.cpp"
                          ,0x82,
                          "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                         );
          }
          Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&pixels);
          iVar6 = Imf_2_5::globalThreadCount();
          Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                    ((TiledRgbaInputFile *)&pixels,_Var1._M_p,iVar6);
          bVar5 = Imf_2_5::TiledRgbaInputFile::isComplete((TiledRgbaInputFile *)&pixels);
          if (!bVar5) {
            Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&pixels);
            remove(csl._M_dataplus._M_p);
            remove(icsl._M_dataplus._M_p);
            remove(ct._M_dataplus._M_p);
            remove(ict._M_dataplus._M_p);
            poVar8 = std::operator<<((ostream *)&std::cout,"ok\n");
            std::endl<char,std::char_traits<char>>(poVar8);
            std::__cxx11::string::~string((string *)&ict);
            std::__cxx11::string::~string((string *)&ct);
            std::__cxx11::string::~string((string *)&icsl);
            std::__cxx11::string::~string((string *)&csl);
            return;
          }
          __assert_fail("!in.isComplete()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testIsComplete.cpp"
                        ,0x87,
                        "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                       );
        }
        __assertion = "!in.isComplete()";
        __line = 0x7d;
      }
      else {
        __assertion = "in.isComplete()";
        __line = 0x78;
      }
    }
  }
  else {
    __assertion = "in.isComplete()";
    __line = 0x6e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testIsComplete.cpp"
                ,__line,
                "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
               );
}

Assistant:

void
testIsComplete (const std::string &tempDir)
{
    try
    {
	cout << "Testing isComplete() function" << endl;

	std::string csl = tempDir + "imf_test_complete_sl.exr";
	std::string icsl = tempDir + "imf_test_incomplete_sl.exr";
	std::string ct = tempDir + "imf_test_complete_t.exr";
	std::string ict = tempDir + "imf_test_incomplete_t.exr";

	writeFiles (csl.c_str(), icsl.c_str(), ct.c_str(), ict.c_str(), 327, 289, 17, 17);
	checkFiles (csl.c_str(), icsl.c_str(), ct.c_str(), ict.c_str());

	remove (csl.c_str());
	remove (icsl.c_str());
	remove (ct.c_str());
	remove (ict.c_str());

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}